

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_deviate_delete_unique
              (lys_module *module,lys_deviate *deviate,lys_node_list *list,int index,char *value)

{
  lys_ext_instance ***ext;
  int iVar1;
  lys_unique *plVar2;
  byte bVar3;
  lys_unique *plVar4;
  lys_ext_instance **ext_00;
  ulong uVar5;
  ulong uVar6;
  
  if ((ulong)list->unique_size != 0) {
    plVar4 = (lys_unique *)&list->unique;
    plVar2 = list->unique;
    bVar3 = deviate->unique[index].expr_size;
    uVar6 = 0;
    do {
      if (plVar2[uVar6].expr_size == bVar3) {
        if ((ulong)bVar3 == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = 0;
          while (plVar2[uVar6].expr[uVar5] == deviate->unique[index].expr[uVar5]) {
            uVar5 = uVar5 + 1;
            if (bVar3 == uVar5) goto LAB_0014db1a;
          }
        }
        if ((uint)uVar5 == (uint)bVar3) {
LAB_0014db1a:
          plVar2 = plVar2 + uVar6;
          if (bVar3 != 0) {
            uVar5 = 0;
            do {
              lydict_remove(module->ctx,plVar2->expr[uVar5]);
              uVar5 = uVar5 + 1;
              plVar2 = *(lys_unique **)plVar4 + uVar6;
            } while (uVar5 < (*(lys_unique **)plVar4)[uVar6].expr_size);
          }
          free(plVar2->expr);
          bVar3 = list->unique_size - 1;
          list->unique_size = bVar3;
          if (uVar6 != bVar3) {
            plVar2 = *(lys_unique **)plVar4;
            plVar2[uVar6].expr_size = plVar2[bVar3].expr_size;
            plVar2[uVar6].expr = plVar2[bVar3].expr;
          }
          plVar2 = *(lys_unique **)plVar4;
          if (bVar3 == 0) {
            free(plVar2);
          }
          else {
            plVar4 = plVar2 + bVar3;
            plVar2[bVar3].expr_size = '\0';
          }
          plVar4->expr = (char **)0x0;
          iVar1 = lys_ext_iter(list->ext,list->ext_size,'\0',LYEXT_SUBSTMT_UNIQUE);
          if (iVar1 == -1) {
            return 0;
          }
          ext = &list->ext;
          do {
            ext_00 = *ext;
            bVar3 = ext_00[iVar1]->insubstmt_index;
            if ((uint)uVar6 == (uint)bVar3) {
              lyp_ext_instance_rm(module->ctx,ext,&list->ext_size,(uint8_t)iVar1);
              iVar1 = iVar1 + -1;
              ext_00 = *ext;
            }
            else if ((uint)uVar6 < (uint)bVar3) {
              ext_00[iVar1]->insubstmt_index = bVar3 - 1;
            }
            iVar1 = lys_ext_iter(ext_00,list->ext_size,(char)iVar1 + '\x01',LYEXT_SUBSTMT_UNIQUE);
          } while (iVar1 != -1);
          return 0;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != list->unique_size);
  }
  ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"unique");
  ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Value differs from the target being deleted.");
  return 1;
}

Assistant:

int
yang_deviate_delete_unique(struct lys_module *module, struct lys_deviate *deviate,
                           struct lys_node_list *list, int index, char * value)
{
    int i, j, k;

    /* find unique structures to delete */
    for (i = 0; i < list->unique_size; i++) {
        if (list->unique[i].expr_size != deviate->unique[index].expr_size) {
            continue;
        }

        for (j = 0; j < deviate->unique[index].expr_size; j++) {
            if (!ly_strequal(list->unique[i].expr[j], deviate->unique[index].expr[j], 1)) {
                break;
            }
        }

        if (j == deviate->unique[index].expr_size) {
            /* we have a match, free the unique structure ... */
            for (j = 0; j < list->unique[i].expr_size; j++) {
                lydict_remove(module->ctx, list->unique[i].expr[j]);
            }
            free(list->unique[i].expr);
            /* ... and maintain the array */
            list->unique_size--;
            if (i != list->unique_size) {
                list->unique[i].expr_size = list->unique[list->unique_size].expr_size;
                list->unique[i].expr = list->unique[list->unique_size].expr;
            }

            if (!list->unique_size) {
                free(list->unique);
                list->unique = NULL;
            } else {
                list->unique[list->unique_size].expr_size = 0;
                list->unique[list->unique_size].expr = NULL;
            }

            k = i; /* remember index for removing extensions */
            i = -1; /* set match flag */
            break;
        }
    }

    if (i != -1) {
        /* no match found */
        LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "unique");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Value differs from the target being deleted.");
        return EXIT_FAILURE;
    }

    /* remove extensions of this unique instance from the target node */
    j = -1;
    while ((j = lys_ext_iter(list->ext, list->ext_size, j + 1, LYEXT_SUBSTMT_UNIQUE)) != -1) {
        if (list->ext[j]->insubstmt_index == k) {
            lyp_ext_instance_rm(module->ctx, &list->ext, &list->ext_size, j);
            --j;
        } else if (list->ext[j]->insubstmt_index > k) {
            /* decrease the substatement index of the extension because of the changed array of uniques */
            list->ext[j]->insubstmt_index--;
        }
    }
    return EXIT_SUCCESS;
}